

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O2

GenericFuncType __thiscall eglw::anon_unknown_0::CoreLoader::get(CoreLoader *this,char *name)

{
  int iVar1;
  undefined4 extraout_var;
  deFunctionPtr p_Var3;
  __eglMustCastToProperFunctionPointerType p_Var4;
  GenericFuncType p_Var2;
  
  iVar1 = (*this->m_staticLib->_vptr_FunctionLibrary[2])();
  p_Var2 = (GenericFuncType)CONCAT44(extraout_var,iVar1);
  if (p_Var2 == (GenericFuncType)0x0) {
    if ((this->m_dynLib != (DynamicLibrary *)0x0) &&
       (p_Var3 = de::DynamicLibrary::getFunction(this->m_dynLib,name), p_Var3 != (deFunctionPtr)0x0)
       ) {
      return p_Var3;
    }
    if (this->m_getProcAddress != (eglGetProcAddressFunc)0x0) {
      p_Var4 = (*this->m_getProcAddress)(name);
      return p_Var4;
    }
    p_Var2 = (GenericFuncType)0x0;
  }
  return p_Var2;
}

Assistant:

GenericFuncType get (const char* name) const
	{
		GenericFuncType res = (GenericFuncType)DE_NULL;

		res = (GenericFuncType)m_staticLib->getFunction(name);

		if (!res && m_dynLib)
			res = (GenericFuncType)m_dynLib->getFunction(name);

		if (!res && m_getProcAddress)
			res = (GenericFuncType)m_getProcAddress(name);

		return res;
	}